

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O3

char * Qiniu_Mac_SignToken(Qiniu_Mac *self,char *policy_str)

{
  char *data;
  char *s1;
  char *pcVar1;
  
  data = Qiniu_String_Encode(policy_str);
  s1 = Qiniu_Mac_Sign(self,data);
  pcVar1 = Qiniu_String_Concat3(s1,":",data);
  Qiniu_Free(s1);
  Qiniu_Free(data);
  return pcVar1;
}

Assistant:

char *Qiniu_Mac_SignToken(Qiniu_Mac *self, char *policy_str)
{
	char *data;
	char *sign;
	char *token;

	data = Qiniu_String_Encode(policy_str);
	sign = Qiniu_Mac_Sign(self, data);
	token = Qiniu_String_Concat3(sign, ":", data);

	Qiniu_Free(sign);
	Qiniu_Free(data);

	return token;
}